

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O1

void list_vulkan_instance_extensions(void)

{
  uint in_EAX;
  VkResult VVar1;
  VkExtensionProperties *__ptr;
  ulong uVar2;
  VkExtensionProperties *pVVar3;
  uint32_t ep_count;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  puts("Vulkan instance extensions:");
  VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                    ((char *)0x0,(uint32_t *)((long)&uStack_28 + 4),(VkExtensionProperties *)0x0);
  if (VVar1 == VK_SUCCESS) {
    __ptr = (VkExtensionProperties *)calloc(uStack_28 >> 0x20,0x104);
    VVar1 = (*glad_vkEnumerateInstanceExtensionProperties)
                      ((char *)0x0,(uint32_t *)((long)&uStack_28 + 4),__ptr);
    if ((VVar1 == VK_SUCCESS) && (uStack_28._4_4_ != 0)) {
      uVar2 = 0;
      pVVar3 = __ptr;
      do {
        printf(" %s (v%u)\n",pVVar3,(ulong)pVVar3->specVersion);
        uVar2 = uVar2 + 1;
        pVVar3 = pVVar3 + 1;
      } while (uVar2 < uStack_28 >> 0x20);
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void list_vulkan_instance_extensions(void)
{
    uint32_t i, ep_count = 0;
    VkExtensionProperties* ep;

    printf("Vulkan instance extensions:\n");

    if (vkEnumerateInstanceExtensionProperties(NULL, &ep_count, NULL) != VK_SUCCESS)
        return;

    ep = calloc(ep_count, sizeof(VkExtensionProperties));

    if (vkEnumerateInstanceExtensionProperties(NULL, &ep_count, ep) != VK_SUCCESS)
    {
        free(ep);
        return;
    }

    for (i = 0;  i < ep_count;  i++)
        printf(" %s (v%u)\n", ep[i].extensionName, ep[i].specVersion);

    free(ep);
}